

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS UnmarshallDictionary
                    (JlDataObject *DictionaryObject,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,void *Structure
                    ,size_t *pErrorAtPos)

{
  JL_DATA_TYPE JVar1;
  uint32_t uVar2;
  void *Output;
  size_t sVar3;
  void *dataSizeElementInStruct;
  void *arrayCountPtr;
  size_t arrayCount;
  void *elementInStruct;
  JlDataObject *pJStack_50;
  JL_DATA_TYPE objectType;
  JlDataObject *object;
  JlMarshallElement *currentItem;
  uint32_t i;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  void *Structure_local;
  size_t sStack_20;
  _Bool IgnoreExistingValuesInStruct_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  JlDataObject *DictionaryObject_local;
  
  currentItem._4_4_ = JL_STATUS_SUCCESS;
  _i = pErrorAtPos;
  pErrorAtPos_local = (size_t *)Structure;
  Structure_local._7_1_ = IgnoreExistingValuesInStruct;
  sStack_20 = StructDescriptionCount;
  StructDescriptionCount_local = (size_t)StructDescription;
  StructDescription_local = (JlMarshallElement *)DictionaryObject;
  for (currentItem._0_4_ = 0;
      (uint)currentItem < sStack_20 && currentItem._4_4_ == JL_STATUS_SUCCESS;
      currentItem._0_4_ = (uint)currentItem + 1) {
    object = (JlDataObject *)(StructDescriptionCount_local + (ulong)(uint)currentItem * 0x60);
    pJStack_50 = (JlDataObject *)0x0;
    currentItem._4_4_ =
         JlGetObjectFromDictionaryByKey
                   ((JlDataObject *)StructDescription_local,(char *)object->Tag,
                    &stack0xffffffffffffffb0);
    if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
      Output = (void *)((long)pErrorAtPos_local + (long)(object->field_2).List.ListHead);
      JVar1 = JlGetObjectType(pJStack_50);
      if ((((object->field_2).Boolean & 1U) == 0) || (JVar1 != JL_DATA_TYPE_LIST)) {
        if (object->Type == JVar1) {
          if ((*(byte *)((long)&object[1].field_2 + 0x15) & 1) == 0) {
            currentItem._4_4_ =
                 UnmarshalObject(pJStack_50,(JlMarshallElement *)object,
                                 (_Bool)(Structure_local._7_1_ & 1),Output,_i);
          }
          else {
            currentItem._4_4_ =
                 UnmarshalBinary(pJStack_50,
                                 (void *)((long)pErrorAtPos_local + *(long *)(object + 1)),
                                 object[1].Tag,(JlMarshallElement *)object,
                                 (_Bool)(Structure_local._7_1_ & 1),Output,_i);
          }
        }
        else {
          currentItem._4_4_ = JL_STATUS_WRONG_TYPE;
          if (_i != (size_t *)0x0) {
            sVar3 = JlGetObjectTag(pJStack_50);
            *_i = sVar3;
          }
        }
      }
      else {
        uVar2 = JlGetListCount(pJStack_50);
        currentItem._4_4_ = JlMemoryVerifyCountFieldLargeEnoughForValue(object[1].Tag,(ulong)uVar2);
        if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
          currentItem._4_4_ =
               UnmarshalList(pJStack_50,(JlMarshallElement *)object,
                             (_Bool)(Structure_local._7_1_ & 1),Output,
                             (void *)((long)pErrorAtPos_local + *(long *)(object + 1)),object[1].Tag
                             ,_i);
        }
        if (((currentItem._4_4_ != JL_STATUS_SUCCESS) && (_i != (size_t *)0x0)) && (*_i == 0)) {
          sVar3 = JlGetObjectTag(pJStack_50);
          *_i = sVar3;
        }
      }
    }
    else if (currentItem._4_4_ == JL_STATUS_NOT_FOUND) {
      currentItem._4_4_ = JL_STATUS_SUCCESS;
    }
  }
  return currentItem._4_4_;
}

Assistant:

static
JL_STATUS
    UnmarshallDictionary
    (
        JlDataObject const*         DictionaryObject,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Structure,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];

        // Get object
        JlDataObject* object = NULL;
        JL_DATA_TYPE objectType = JL_DATA_TYPE_NONE;

        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            void* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);
            objectType = JlGetObjectType( object );

            if( currentItem->IsArray && JL_DATA_TYPE_LIST == objectType )
            {
                // First verify that the count field is large enough
                size_t arrayCount = JlGetListCount( object );
                jlStatus = JlMemoryVerifyCountFieldLargeEnoughForValue( currentItem->CountFieldSize, arrayCount );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Unmarshall the list
                    void* arrayCountPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    jlStatus = UnmarshalList(
                        object,
                        currentItem,
                        IgnoreExistingValuesInStruct,
                        elementInStruct,
                        arrayCountPtr,
                        currentItem->CountFieldSize,
                        pErrorAtPos );
                }

                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    if( NULL != pErrorAtPos && 0 == *pErrorAtPos )
                    {
                        *pErrorAtPos = JlGetObjectTag( object );
                    }
                }
            }
            else if( currentItem->Type == objectType )
            {
                if( currentItem->IsBase64 )
                {
                    void* dataSizeElementInStruct = (void*)(((uint8_t*)Structure)+currentItem->CountFieldOffset);
                    jlStatus = UnmarshalBinary( object, dataSizeElementInStruct, currentItem->CountFieldSize, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
                else
                {
                    jlStatus = UnmarshalObject( object, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
            }
            else
            {
                // Wrong type
                jlStatus = JL_STATUS_WRONG_TYPE;
                if( NULL != pErrorAtPos )
                {
                    *pErrorAtPos = JlGetObjectTag( object );
                }
            }

        }
        else if( JL_STATUS_NOT_FOUND == jlStatus )
        {
            // Keyname not found in dictionary. Do not consider this an error, we just don't have any value for this item, so we leave
            // it as default
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}